

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_short,unsigned_short>
          (Thread *this,BinopFunc<unsigned_short,_unsigned_short> *f)

{
  unsigned_short uVar1;
  u8 i;
  long lVar2;
  Value VVar3;
  SR result;
  Simd<unsigned_short,_(unsigned_char)__b_> lhs;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  
  VVar3 = Pop(this);
  local_38.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    uVar1 = (*f)(*(unsigned_short *)((long)&local_38 + lVar2 * 2),VVar3.field_0._0_2_);
    *(unsigned_short *)((long)&local_48 + lVar2 * 2) = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}